

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

Vec_Str_t *
Abc_SclProduceGenlibStrProfile
          (SC_Lib *p,Mio_Library_t *pLib,float Slew,float Gain,int nGatesMin,int *pnCellCount)

{
  int iVar1;
  SC_Cell *pSVar2;
  Vec_Str_t *p_00;
  Mio_Gate_t *pGate;
  size_t sVar3;
  char *pcVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  char *pStr;
  SC_Lib *pSVar8;
  float fVar9;
  int local_130;
  char Buffer [200];
  
  iVar7 = 0;
  for (iVar6 = 0; iVar6 < (p->vCellClasses).nSize; iVar6 = iVar6 + 1) {
    pSVar2 = (SC_Cell *)Vec_PtrEntry(&p->vCellClasses,iVar6);
    if ((pSVar2->n_outputs == 1) && (iVar1 = Abc_SclClassCellNum(pSVar2), iVar7 <= iVar1)) {
      iVar7 = iVar1;
    }
  }
  iVar6 = 0;
  if (nGatesMin < iVar7) {
    iVar6 = nGatesMin;
  }
  if (nGatesMin == 0) {
    iVar6 = nGatesMin;
  }
  pSVar8 = p;
  Abc_SclMarkSkippedCells(p);
  p_00 = Vec_StrAlloc((int)pSVar8);
  Vec_StrPrintStr(p_00,"GATE _const0_            0.00 z=CONST0;\n");
  Vec_StrPrintStr(p_00,"GATE _const1_            0.00 z=CONST1;\n");
  local_130 = 2;
  iVar7 = 0;
  do {
    if ((p->vCells).nSize <= iVar7) {
      Vec_StrPrintStr(p_00,"\n.end\n");
      Vec_StrPush(p_00,'\0');
      if (pnCellCount != (int *)0x0) {
        *pnCellCount = local_130;
      }
      return p_00;
    }
    pSVar2 = (SC_Cell *)Vec_PtrEntry(&p->vCells,iVar7);
    iVar1 = pSVar2->n_inputs;
    if ((iVar1 != 0) && (pSVar2->n_outputs < 2)) {
      if ((iVar6 == 0) || (iVar1 < 3)) {
        if (1 < iVar1) goto LAB_0036d9eb;
LAB_0036da13:
        sVar3 = strlen(pSVar2->pName);
        if (199 < sVar3) {
          __assert_fail("strlen(pRepr->pName) < 200",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                        ,0x3c3,
                        "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                       );
        }
        Vec_StrPrintStr(p_00,"GATE ");
        sprintf(Buffer,"%-16s",pSVar2->pName);
        Vec_StrPrintStr(p_00,Buffer);
        Vec_StrPrintStr(p_00," ");
        sprintf(Buffer,"%7.2f",(double)pSVar2->area);
        Vec_StrPrintStr(p_00,Buffer);
        Vec_StrPrintStr(p_00," ");
        pcVar4 = SC_CellPinName(pSVar2,pSVar2->n_inputs);
        Vec_StrPrintStr(p_00,pcVar4);
        iVar1 = 0x77c028;
        Vec_StrPrintStr(p_00,"=");
        pcVar4 = SC_CellPinOutFunc(pSVar2,iVar1);
        pStr = "?";
        if (pcVar4 != (char *)0x0) {
          pStr = SC_CellPinOutFunc(pSVar2,0x77d3c0);
        }
        Vec_StrPrintStr(p_00,pStr);
        Vec_StrPrintStr(p_00,";\n");
        for (iVar1 = 0; iVar1 < pSVar2->n_inputs; iVar1 = iVar1 + 1) {
          pSVar8 = (SC_Lib *)&pSVar2->vPins;
          puVar5 = (undefined8 *)Vec_PtrEntry(&pSVar2->vPins,iVar1);
          fVar9 = Abc_SclComputeDelayClassPin(pSVar8,pSVar2,iVar1,Slew,Gain);
          if (fVar9 <= 0.0) {
            __assert_fail("Delay > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                          ,0x3d3,
                          "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                         );
          }
          Vec_StrPrintStr(p_00,"         PIN ");
          sprintf(Buffer,"%-4s",*puVar5);
          Vec_StrPrintStr(p_00,Buffer);
          sprintf(Buffer," UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n",(double)fVar9,
                  SUB84((double)fVar9,0));
          Vec_StrPrintStr(p_00,Buffer);
        }
        local_130 = local_130 + 1;
      }
      else {
        iVar1 = Abc_SclClassCellNum(pSVar2);
        if (iVar6 <= iVar1) {
LAB_0036d9eb:
          pGate = Mio_LibraryReadGateByName(pLib,pSVar2->pName,(char *)0x0);
          if ((pGate != (Mio_Gate_t *)0x0) && (iVar1 = Mio_GateReadProfile(pGate), iVar1 != 0))
          goto LAB_0036da13;
        }
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrProfile( SC_Lib * p, Mio_Library_t * pLib, float Slew, float Gain, int nGatesMin, int * pnCellCount )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pRepr;
    SC_Pin * pPin;
    int i, k, Count = 2, nClassMax = 0;
    // find the largest number of cells in a class
    SC_LibForEachCellClass( p, pRepr, i )
        if ( pRepr->n_outputs == 1 )
            nClassMax = Abc_MaxInt( nClassMax, Abc_SclClassCellNum(pRepr) );
    // update the number
    if ( nGatesMin && nGatesMin >= nClassMax )
        nGatesMin = 0;
    // mark skipped cells
    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pRepr, i )
    {
        if ( pRepr->n_inputs == 0 )
            continue;
        if ( pRepr->n_outputs > 1 )
            continue;
        if ( nGatesMin && pRepr->n_inputs > 2 && Abc_SclClassCellNum(pRepr) < nGatesMin )
            continue;
        // check if the gate is in the profile
        if ( pRepr->n_inputs > 1 )
        {
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pRepr->pName, NULL );
            if ( pGate == NULL || Mio_GateReadProfile(pGate) == 0 )
                continue;
        }
        // process gate
        assert( strlen(pRepr->pName) < 200 );
        Vec_StrPrintStr( vStr, "GATE " );
        sprintf( Buffer, "%-16s", pRepr->pName );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
//        sprintf( Buffer, "%7.2f", Abc_SclComputeAreaClass(pRepr) );
        sprintf( Buffer, "%7.2f", pRepr->area );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintStr( vStr, SC_CellPinName(pRepr, pRepr->n_inputs) );
        Vec_StrPrintStr( vStr, "=" );
        Vec_StrPrintStr( vStr, SC_CellPinOutFunc(pRepr, 0) ? SC_CellPinOutFunc(pRepr, 0) : "?" );
        Vec_StrPrintStr( vStr, ";\n" );
        SC_CellForEachPinIn( pRepr, pPin, k )
        {
            float Delay = Abc_SclComputeDelayClassPin( p, pRepr, k, Slew, Gain );
            assert( Delay > 0 );
            Vec_StrPrintStr( vStr, "         PIN " );
            sprintf( Buffer, "%-4s", pPin->pName );
            Vec_StrPrintStr( vStr, Buffer );
            sprintf( Buffer, " UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n", Delay, Delay );
            Vec_StrPrintStr( vStr, Buffer );
        }
        Count++;
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    if ( pnCellCount )
        *pnCellCount = Count;
    return vStr;
}